

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O2

void LockSignal_SignalShouldBeLocked(void)

{
  signal<void_()> sg;
  
  TestRunner::StartTest("LockSignal_SignalShouldBeLocked");
  std::make_shared<lsignal::signal<void()>::internal_data>();
  (sg._data.super___shared_ptr<lsignal::signal<void_()>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr)->_locked = true;
  AssertHelper::VerifyValue(true,true,"Signal should be locked.");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sg._data.
              super___shared_ptr<lsignal::signal<void_()>::internal_data,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void LockSignal_SignalShouldBeLocked()
{
	TestRunner::StartTest(MethodName);

	lsignal::signal<void()> sg;

	sg.set_lock(true);

	AssertHelper::VerifyValue(sg.is_locked(), true, "Signal should be locked.");
}